

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

float __thiscall
crnlib::adaptive_arith_data_model::get_cost(adaptive_arith_data_model *this,uint sym)

{
  uint bit_00;
  adaptive_bit_model *this_00;
  float fVar1;
  float local_20;
  uint bit;
  float cost;
  uint bitmask;
  uint node;
  uint sym_local;
  adaptive_arith_data_model *this_local;
  
  cost = 1.4013e-45;
  bit = this->m_total_syms;
  local_20 = 0.0;
  do {
    bit = bit >> 1;
    bit_00 = (uint)((sym & bit) != 0);
    this_00 = vector<crnlib::adaptive_bit_model>::operator[](&this->m_probs,(uint)cost);
    fVar1 = adaptive_bit_model::get_cost(this_00,bit_00);
    local_20 = fVar1 + local_20;
    cost = (float)((int)cost * 2 + bit_00);
  } while (1 < bit);
  return local_20;
}

Assistant:

float adaptive_arith_data_model::get_cost(uint sym) const {
  uint node = 1;

  uint bitmask = m_total_syms;

  float cost = 0.0f;
  do {
    bitmask >>= 1;

    uint bit = (sym & bitmask) ? 1 : 0;
    cost += m_probs[node].get_cost(bit);
    node = (node << 1) + bit;

  } while (bitmask > 1);

  return cost;
}